

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

string * __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>::LogMsg
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> *this,string *msg)

{
  long lVar1;
  bool bVar2;
  type fmt;
  double *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  type duration;
  time_point end_time;
  optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  *in_stack_ffffffffffffff98;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  duration<long,_std::ratio<1L,_1000000000L>_> d;
  string *args;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d.__r = (rep)in_RDI;
  args = in_RDI;
  std::chrono::_V2::steady_clock::now();
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffff98);
  if (bVar2) {
    std::
    optional<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ::operator*(in_stack_ffffffffffffff98);
    fmt = std::chrono::operator-
                    (in_stack_ffffffffffffffa0,
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_ffffffffffffff98);
    Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (d);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,double>
              ((char *)fmt.__r,args,in_RSI,in_RDX);
  }
  else {
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffffd8,args,in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string LogMsg(const std::string& msg)
    {
        const auto end_time{std::chrono::steady_clock::now()};
        if (!m_start_t) {
            return strprintf("%s: %s", m_prefix, msg);
        }
        const auto duration{end_time - *m_start_t};

        if constexpr (std::is_same<TimeType, std::chrono::microseconds>::value) {
            return strprintf("%s: %s (%iμs)", m_prefix, msg, Ticks<std::chrono::microseconds>(duration));
        } else if constexpr (std::is_same<TimeType, std::chrono::milliseconds>::value) {
            return strprintf("%s: %s (%.2fms)", m_prefix, msg, Ticks<MillisecondsDouble>(duration));
        } else if constexpr (std::is_same<TimeType, std::chrono::seconds>::value) {
            return strprintf("%s: %s (%.2fs)", m_prefix, msg, Ticks<SecondsDouble>(duration));
        } else {
            static_assert(ALWAYS_FALSE<TimeType>, "Error: unexpected time type");
        }
    }